

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

BinarySection *
flatbuffers::anon_unknown_49::GenerateMissingSection
          (BinarySection *__return_storage_ptr__,uint64_t offset,uint64_t length,uint8_t *binary)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  bool bVar7;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegionComment comment;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_2e8;
  BinaryRegionStatus local_2c8;
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  BinaryRegionCommentType local_2a0;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  size_t local_258;
  long *local_250 [2];
  long local_240 [2];
  undefined1 local_230 [48];
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  BinaryRegionCommentType local_128;
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  size_t local_e0;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  BinaryRegionCommentType local_b0;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  size_t local_68;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_60;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_2e8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = length + offset;
  bVar7 = offset < uVar1;
  if ((offset < uVar1) && (binary[offset] == '\0')) {
    lVar3 = length - 1;
    uVar2 = offset + 1;
    do {
      uVar5 = uVar2;
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar7) break;
      uVar2 = uVar5 + 1;
    } while (binary[uVar5] == '\0');
    bVar7 = uVar5 < uVar1;
  }
  local_2c0 = &local_2b0;
  if (bVar7) {
    local_2c8 = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2a0 = Unknown;
    local_298 = &local_288;
    local_290 = 0;
    local_288 = 0;
    local_278 = &local_268;
    local_270 = 0;
    local_268 = 0;
    local_258 = 0;
    if (length < 8) {
      plVar4 = local_180;
      local_190[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"");
      local_2c8 = WARN_CORRUPTED_PADDING;
      std::__cxx11::string::_M_assign((string *)&local_2c0);
      plVar6 = local_190[0];
    }
    else {
      plVar4 = local_160;
      local_170[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"");
      local_2c8 = WARN_NO_REFERENCES;
      std::__cxx11::string::_M_assign((string *)&local_2c0);
      plVar6 = local_170[0];
    }
    if (plVar6 != plVar4) {
      operator_delete(plVar6,*plVar4 + 1);
    }
    local_d8._0_4_ = local_2c8;
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_2c0,local_2c0 + local_2b8);
    local_b0 = local_2a0;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_298,local_298 + local_290);
    local_88._M_p = (pointer)&local_78;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_278,local_278 + local_270);
    local_68 = local_258;
    MakeBinaryRegion((BinaryRegion *)local_230,offset,length,Unknown,length,0,
                     (BinaryRegionComment *)local_d8);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_2e8,(BinaryRegion *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != &local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_p != &local_1f0) {
      operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"no known references","");
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(__return_storage_ptr__,(string *)local_230,Unknown,&local_48);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_48);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
    if (local_298 == &local_288) goto LAB_00318390;
  }
  else {
    local_2c8 = OK;
    local_2b8 = 0;
    local_2b0 = 0;
    local_290 = 0;
    local_288 = 0;
    local_278 = &local_268;
    local_270 = 0;
    local_268 = 0;
    local_258 = 0;
    local_2a0 = Padding;
    local_298 = &local_288;
    if (7 < length) {
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"");
      local_2c8 = WARN_PADDING_LENGTH;
      std::__cxx11::string::_M_assign((string *)&local_2c0);
      if (local_250[0] != local_240) {
        operator_delete(local_250[0],local_240[0] + 1);
      }
    }
    local_150._0_4_ = local_2c8;
    local_148._M_p = (pointer)&local_138;
    std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_2c0,local_2c0 + local_2b8);
    local_128 = local_2a0;
    local_120._M_p = (pointer)&local_110;
    std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_298,local_298 + local_290);
    local_100._M_p = (pointer)&local_f0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_278,local_278 + local_270);
    local_e0 = local_258;
    MakeBinaryRegion((BinaryRegion *)local_230,offset,length,Uint8,length,0,
                     (BinaryRegionComment *)local_150);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_2e8,(BinaryRegion *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != &local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_p != &local_1f0) {
      operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_p != &local_f0) {
      operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != &local_138) {
      operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    }
    local_230._0_8_ = local_230 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
    local_60.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_60.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_60.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2e8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(__return_storage_ptr__,(string *)local_230,Padding,&local_60);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_60);
    if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
    if (local_298 == &local_288) goto LAB_00318390;
  }
  operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
LAB_00318390:
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

static BinarySection GenerateMissingSection(const uint64_t offset,
                                            const uint64_t length,
                                            const uint8_t *const binary) {
  std::vector<BinaryRegion> regions;

  // Check if the region is all zeros or not, as that can tell us if it is
  // padding or not.
  if (IsNonZeroRegion(offset, length, binary)) {
    // Some of the padding bytes are non-zero, so this might be an unknown
    // section of the binary.
    // TODO(dbaileychess): We could be a bit smarter with different sized
    // alignments. For now, the 8 byte check encompasses all the smaller
    // alignments.
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::Unknown;
    if (length >= 8) {
      SetError(comment, BinaryRegionStatus::WARN_NO_REFERENCES);
    } else {
      SetError(comment, BinaryRegionStatus::WARN_CORRUPTED_PADDING);
    }

    regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                       BinaryRegionType::Unknown, length, 0,
                                       comment));

    return MakeBinarySection("no known references", BinarySectionType::Unknown,
                             std::move(regions));
  }

  BinaryRegionComment comment;
  comment.type = BinaryRegionCommentType::Padding;
  if (length >= 8) {
    SetError(comment, BinaryRegionStatus::WARN_PADDING_LENGTH);
  }

  // This region is most likely padding.
  regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                     BinaryRegionType::Uint8, length, 0,
                                     comment));

  return MakeBinarySection("", BinarySectionType::Padding, std::move(regions));
}